

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::Shape(Shape *this)

{
  Drawable *in_RDI;
  size_t unaff_retaddr;
  PrimitiveType in_stack_0000000c;
  VertexArray *in_stack_00000010;
  Transformable *in_stack_ffffffffffffffd0;
  
  Drawable::Drawable(in_RDI);
  Transformable::Transformable(in_stack_ffffffffffffffd0);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__Shape_002bc5e8;
  in_RDI[1]._vptr_Drawable = (_func_int **)&PTR__Shape_002bc620;
  in_RDI[0x17]._vptr_Drawable = (_func_int **)0x0;
  Rect<int>::Rect((Rect<int> *)(in_RDI + 0x18));
  Color::Color((Color *)(in_RDI + 0x1a),0xff,0xff,0xff,0xff);
  Color::Color((Color *)((long)&in_RDI[0x1a]._vptr_Drawable + 4),0xff,0xff,0xff,0xff);
  *(undefined4 *)&in_RDI[0x1b]._vptr_Drawable = 0;
  VertexArray::VertexArray(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  VertexArray::VertexArray(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  Rect<float>::Rect((Rect<float> *)(in_RDI + 0x26));
  Rect<float>::Rect((Rect<float> *)(in_RDI + 0x28));
  return;
}

Assistant:

Shape::Shape() :
m_texture         (NULL),
m_textureRect     (),
m_fillColor       (255, 255, 255),
m_outlineColor    (255, 255, 255),
m_outlineThickness(0),
m_vertices        (TriangleFan),
m_outlineVertices (TriangleStrip),
m_insideBounds    (),
m_bounds          ()
{
}